

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O0

void __thiscall
prevector_tests::prevector_tester<8U,_int>::insert
          (prevector_tester<8U,_int> *this,Size position,int *value)

{
  long lVar1;
  const_iterator __position;
  iterator this_00;
  iterator value_00;
  prevector<8U,_int,_unsigned_int,_int> *in_RDI;
  size_type n;
  long in_FS_OFFSET;
  undefined4 in_stack_00000030;
  prevector_tester<8U,_int> *in_stack_000000e8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffa8
  ;
  value_type_conflict2 *in_stack_ffffffffffffffd8;
  iterator in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)in_RDI);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_ffffffffffffffa8,(difference_type)in_RDI);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            (in_stack_ffffffffffffffa8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
  __position._M_current._4_4_ = position;
  __position._M_current._0_4_ = in_stack_00000030;
  std::vector<int,_std::allocator<int>_>::insert
            ((vector<int,_std::allocator<int>_> *)this_00._M_current,__position,
             in_stack_ffffffffffffffd8);
  n = (size_type)((ulong)((long)&in_RDI[1]._union + 8) >> 0x20);
  value_00 = prevector<8U,_int,_unsigned_int,_int>::begin(in_RDI);
  prevector<8U,_int,_unsigned_int,_int>::iterator::operator+((iterator *)in_RDI,n);
  prevector<8U,_int,_unsigned_int,_int>::insert
            ((prevector<8U,_int,_unsigned_int,_int> *)this_00._M_current,in_stack_fffffffffffffff0,
             value_00.ptr);
  test(in_stack_000000e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(Size position, const T& value) {
        real_vector.insert(real_vector.begin() + position, value);
        pre_vector.insert(pre_vector.begin() + position, value);
        test();
    }